

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_data_lzh(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint16_t uVar1;
  wchar_t wVar2;
  void *pvVar3;
  undefined4 uStack_40;
  wchar_t r;
  ssize_t bytes_avail;
  lha *lha;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  lha = (lha *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(char *)(bytes_avail + 299) == '\0') {
    wVar2 = lzh_decode_init((lzh_stream *)(bytes_avail + 0x170),(char *)(bytes_avail + 0x29));
    if (wVar2 == L'\xffffffe7') {
      *size_local = 0;
      *offset_local = 0;
      lha->entry_offset = 0;
      archive_set_error((archive *)buff_local,0x54,"Unsupported lzh compression method -%c%c%c-",
                        (ulong)(uint)(int)*(char *)(bytes_avail + 0x29),
                        (ulong)(uint)(int)*(char *)(bytes_avail + 0x2a),
                        (ulong)(uint)(int)*(char *)(bytes_avail + 0x2b));
      archive_read_format_lha_read_data_skip((archive_read *)buff_local);
      return L'\xffffffec';
    }
    if (wVar2 != L'\0') {
      archive_set_error((archive *)buff_local,0xc,"Couldn\'t allocate memory for lzh decompression")
      ;
      return L'\xffffffe2';
    }
    *(undefined1 *)(bytes_avail + 299) = 1;
    *(undefined4 *)(bytes_avail + 400) = 0;
    *(undefined8 *)(bytes_avail + 0x198) = 0;
  }
  pvVar3 = __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&stack0xffffffffffffffc0);
  *(void **)(bytes_avail + 0x170) = pvVar3;
  if (_uStack_40 < 1) {
    archive_set_error((archive *)buff_local,0x54,"Truncated LHa file body");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if (*(long *)(bytes_avail + 8) < _uStack_40) {
      _uStack_40 = *(long *)(bytes_avail + 8);
    }
    *(undefined4 *)(bytes_avail + 0x178) = uStack_40;
    *(undefined8 *)(bytes_avail + 0x180) = 0;
    *(undefined4 *)(bytes_avail + 400) = 0;
    wVar2 = lzh_decode((lzh_stream *)(bytes_avail + 0x170),
                       (uint)(_uStack_40 == *(long *)(bytes_avail + 8)));
    if (wVar2 != L'\0') {
      if (wVar2 != L'\x01') {
        archive_set_error((archive *)buff_local,-1,"Bad lzh data");
        return L'\xffffffe7';
      }
      *(undefined1 *)(bytes_avail + 300) = 1;
    }
    *(undefined8 *)(bytes_avail + 0x10) = *(undefined8 *)(bytes_avail + 0x180);
    *(long *)(bytes_avail + 8) = *(long *)(bytes_avail + 8) - *(long *)(bytes_avail + 0x180);
    if (*(int *)(bytes_avail + 400) == 0) {
      lha->entry_offset = *(int64_t *)bytes_avail;
      *offset_local = 0;
      *size_local = 0;
      if (*(char *)(bytes_avail + 300) != '\0') {
        wVar2 = lha_end_of_entry((archive_read *)buff_local);
        return wVar2;
      }
    }
    else {
      lha->entry_offset = *(int64_t *)bytes_avail;
      *offset_local = (long)*(int *)(bytes_avail + 400);
      *size_local = *(size_t *)(bytes_avail + 0x188);
      uVar1 = lha_crc16(*(uint16_t *)(bytes_avail + 0x18),(void *)*size_local,*offset_local);
      *(uint16_t *)(bytes_avail + 0x18) = uVar1;
      *(int64_t *)bytes_avail = *offset_local + *(long *)bytes_avail;
    }
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
lha_read_data_lzh(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	ssize_t bytes_avail;
	int r;

	/* If we haven't yet read any data, initialize the decompressor. */
	if (!lha->decompress_init) {
		r = lzh_decode_init(&(lha->strm), lha->method);
		switch (r) {
		case ARCHIVE_OK:
			break;
		case ARCHIVE_FAILED:
        		/* Unsupported compression. */
			*buff = NULL;
			*size = 0;
			*offset = 0;
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unsupported lzh compression method -%c%c%c-",
			    lha->method[0], lha->method[1], lha->method[2]);
			/* We know compressed size; just skip it. */
			archive_read_format_lha_read_data_skip(a);
			return (ARCHIVE_WARN);
		default:
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't allocate memory "
			    "for lzh decompression");
			return (ARCHIVE_FATAL);
		}
		/* We've initialized decompression for this stream. */
		lha->decompress_init = 1;
		lha->strm.avail_out = 0;
		lha->strm.total_out = 0;
	}

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	lha->strm.next_in = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated LHa file body");
		return (ARCHIVE_FATAL);
	}
	if (bytes_avail > lha->entry_bytes_remaining)
		bytes_avail = (ssize_t)lha->entry_bytes_remaining;

	lha->strm.avail_in = (int)bytes_avail;
	lha->strm.total_in = 0;
	lha->strm.avail_out = 0;

	r = lzh_decode(&(lha->strm), bytes_avail == lha->entry_bytes_remaining);
	switch (r) {
	case ARCHIVE_OK:
		break;
	case ARCHIVE_EOF:
		lha->end_of_entry = 1;
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Bad lzh data");
		return (ARCHIVE_FAILED);
	}
	lha->entry_unconsumed = lha->strm.total_in;
	lha->entry_bytes_remaining -= lha->strm.total_in;

	if (lha->strm.avail_out) {
		*offset = lha->entry_offset;
		*size = lha->strm.avail_out;
		*buff = lha->strm.ref_ptr;
		lha->entry_crc_calculated =
		    lha_crc16(lha->entry_crc_calculated, *buff, *size);
		lha->entry_offset += *size;
	} else {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		if (lha->end_of_entry)
			return (lha_end_of_entry(a));
	}
	return (ARCHIVE_OK);
}